

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

bool doctest::operator<(Approx *lhs,double rhs)

{
  bool local_19;
  double rhs_local;
  Approx *lhs_local;
  
  local_19 = false;
  if (lhs->m_value < rhs) {
    local_19 = operator!=(lhs,rhs);
  }
  return local_19;
}

Assistant:

bool operator<(const Approx& lhs, double rhs) { return lhs.m_value < rhs && lhs != rhs; }